

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O2

int imcomp_compress_tile
              (fitsfile *outfptr,long row,int datatype,void *tiledata,long tilelen,long tilenx,
              long tileny,int nullcheck,void *nullflagval,int *status)

{
  double dVar1;
  double zero;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  void *__ptr;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  int iVar8;
  int nx;
  size_t sVar9;
  FITSfile *pFVar10;
  char *pcVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  void *in_stack_ffffffffffffff38;
  short *cbuf;
  undefined1 local_98 [16];
  ulong local_88;
  int intlength;
  int flag;
  size_t local_78;
  size_t clen;
  long hcomp_len;
  double bscale [1];
  double noise3;
  double bzero [1];
  size_t gzip_nelem;
  double noise5;
  double noise2;
  
  gzip_nelem = 0;
  flag = 1;
  bzero[0] = 0.0;
  bscale[0] = 1.0;
  if (0 < *status) {
    return *status;
  }
  uVar4 = CONCAT44(0,datatype);
  pFVar10 = outfptr->Fptr;
  if ((((pFVar10->quantize_level == 9999.0) && (!NAN(pFVar10->quantize_level))) &&
      (1 < pFVar10->compress_type - 0x15U)) &&
     (((datatype - 0x2aU < 0x2a && ((0x30000000001U >> ((ulong)(datatype - 0x2aU) & 0x3f) & 1) != 0)
       ) || (datatype == 0xa3)))) {
    pcVar11 = "Lossless compression of floating point images must use GZIP (imcomp_compress_tile)";
    goto LAB_001bcc1b;
  }
  lVar12 = tilenx;
  if (pFVar10->tilerow != (int *)0x0) {
    lVar12 = (pFVar10->znaxis[0] + -1) / pFVar10->tilesize[0] + 1;
    iVar8 = (int)((row + -1) % lVar12);
    if (pFVar10->tilerow[iVar8] == row) {
      local_98._0_8_ = tilelen;
      free(pFVar10->tiledata[iVar8]);
      free(outfptr->Fptr->tilenullarray[iVar8]);
      outfptr->Fptr->tiledata[iVar8] = (void *)0x0;
      outfptr->Fptr->tilenullarray[iVar8] = (void *)0x0;
      pFVar10 = outfptr->Fptr;
      pFVar10->tilerow[iVar8] = 0;
      pFVar10->tiledatasize[iVar8] = 0;
      pFVar10->tiletype[iVar8] = 0;
      pFVar10->tileanynull[iVar8] = 0;
      tilelen = local_98._0_8_;
    }
  }
  if (pFVar10->compress_type == -1) {
    imcomp_write_nocompress_tile
              (outfptr,row,datatype,tiledata,tilelen,(int)lVar12,in_stack_ffffffffffffff38,status);
    goto LAB_001bcc4e;
  }
  uVar3 = pFVar10->zbitpix;
  local_88 = (ulong)uVar3;
  iVar8 = 0;
  if (pFVar10->cn_zblank == -1) {
    iVar8 = nullcheck;
  }
  iVar5 = pFVar10->zblank;
  if ((int)uVar3 < 1) {
    iVar8 = nullcheck;
  }
  dVar1 = pFVar10->cn_bscale;
  zero = pFVar10->cn_bzero;
  if (datatype == 0xb) {
    local_98._0_8_ = uVar4;
    imcomp_convert_tile_tbyte
              (outfptr,tiledata,tilelen,iVar8,nullflagval,iVar5,uVar3,dVar1,zero,&intlength,status);
  }
  else if (datatype == 0xc) {
    local_98._0_8_ = uVar4;
    imcomp_convert_tile_tsbyte
              (outfptr,tiledata,tilelen,iVar8,nullflagval,iVar5,uVar3,dVar1,zero,&intlength,status);
  }
  else if (datatype == 0x14) {
    local_98._0_8_ = uVar4;
    imcomp_convert_tile_tushort
              (outfptr,tiledata,tilelen,iVar8,nullflagval,iVar5,uVar3,dVar1,zero,&intlength,status);
  }
  else if (datatype == 0x52) {
    local_98._0_8_ = uVar4;
    imcomp_convert_tile_tdouble
              (outfptr,row,tiledata,tilelen,tilenx,tileny,iVar8,nullflagval,iVar5,uVar3,dVar1,zero,
               &intlength,&flag,bscale,bzero,status);
  }
  else if (datatype == 0x1e) {
    local_98._0_8_ = uVar4;
    imcomp_convert_tile_tuint
              ((fitsfile *)pFVar10,tiledata,tilelen,iVar8,nullflagval,iVar5,uVar3,dVar1,zero,
               &intlength,status);
  }
  else if (datatype == 0x1f) {
    local_98._0_8_ = uVar4;
    imcomp_convert_tile_tint
              ((fitsfile *)pFVar10,tiledata,tilelen,iVar8,nullflagval,iVar5,uVar3,dVar1,zero,
               &intlength,status);
  }
  else {
    if (datatype == 0x28) {
      pcVar11 = "Unsigned integer*8 datatype is not supported when writing to compressed images";
LAB_001bcd2e:
      ffpmsg(pcVar11);
      *status = 0x19a;
      return 0x19a;
    }
    if (datatype == 0x29) {
      pcVar11 = "Integer*8 Long datatype is not supported when writing to compressed images";
      goto LAB_001bcd2e;
    }
    if (datatype == 0x2a) {
      local_98._0_8_ = uVar4;
      imcomp_convert_tile_tfloat
                (outfptr,row,tiledata,tilelen,tilenx,tileny,iVar8,nullflagval,iVar5,uVar3,dVar1,zero
                 ,&intlength,&flag,bscale,bzero,status);
    }
    else {
      if (datatype != 0x15) {
        pcVar11 = "unsupported image datatype (imcomp_compress_tile)";
        goto LAB_001bcd2e;
      }
      local_98._0_8_ = uVar4;
      imcomp_convert_tile_tshort
                (outfptr,tiledata,tilelen,iVar8,nullflagval,iVar5,uVar3,dVar1,zero,
                 pFVar10->cn_actual_bzero,&intlength,status);
    }
  }
  auVar14 = local_98;
  if (0 < *status) {
    return *status;
  }
  pFVar10 = outfptr->Fptr;
  if (flag == 0) {
    if (pFVar10->cn_gzip_data < 1) {
      pcVar11 = "1QB";
      if (pFVar10->request_huge_hdu == 0) {
        pcVar11 = "1PB";
      }
      fficol(outfptr,999,"GZIP_COMPRESSED_DATA",pcVar11,status);
      if (*status < 1) {
        ffgcno(outfptr,0,"GZIP_COMPRESSED_DATA",&outfptr->Fptr->cn_gzip_data,status);
      }
    }
    if (auVar14._0_4_ == 0x2a) {
      sVar6 = tilelen * 4;
      auVar13._8_4_ = (int)(sVar6 >> 0x20);
      auVar13._0_8_ = sVar6;
      auVar13._12_4_ = 0x45300000;
      dVar1 = ((auVar13._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0)) * 1.1;
      uVar4 = (ulong)dVar1;
      clen = (long)(dVar1 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
      cbuf = (short *)calloc(clen,1);
      if (cbuf == (short *)0x0) {
LAB_001bd0f2:
        ffpmsg("Memory allocation error. (imcomp_compress_tile)");
        *status = 0x71;
        return 0x71;
      }
      if (iVar8 == 1) {
        imcomp_float2nan((float *)tiledata,tilelen,(int *)tiledata,*nullflagval,status);
      }
      ffswap4((int *)tiledata,tilelen);
    }
    else {
      sVar6 = tilelen * 8;
      auVar14._8_4_ = (int)(sVar6 >> 0x20);
      auVar14._0_8_ = sVar6;
      auVar14._12_4_ = 0x45300000;
      dVar1 = ((auVar14._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0)) * 1.1;
      uVar4 = (ulong)dVar1;
      clen = (long)(dVar1 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
      cbuf = (short *)calloc(clen,1);
      if (cbuf == (short *)0x0) goto LAB_001bd0f2;
      if (iVar8 == 1) {
        imcomp_double2nan((double *)tiledata,tilelen,(LONGLONG *)tiledata,*nullflagval,status);
      }
      ffswap8((double *)tiledata,tilelen);
    }
    compress2mem_from_mem((char *)tiledata,sVar6,(char **)&cbuf,&clen,realloc,&gzip_nelem,status);
    ffpclb(outfptr,outfptr->Fptr->cn_gzip_data,row,1,gzip_nelem,(uchar *)cbuf,status);
  }
  else {
    local_78 = pFVar10->maxelem;
    clen = local_78;
    cbuf = (short *)calloc(local_78,1);
    if (cbuf == (short *)0x0) {
      ffpmsg("Memory allocation failure. (imcomp_compress_tile)");
      *status = 0x71;
      return 0x71;
    }
    iVar2 = pFVar10->compress_type;
    if (iVar2 - 0x15U < 2) {
      fVar15 = pFVar10->quantize_level;
      if (((local_98._0_4_ == 0x2a) && (fVar15 == 9999.0)) && (!NAN(fVar15))) {
        ffswap4((int *)tiledata,tilelen);
        iVar2 = outfptr->Fptr->compress_type;
        goto joined_r0x001bd5a2;
      }
      if (((local_98._0_4_ != 0x52) || (fVar15 != 9999.0)) || (NAN(fVar15))) {
        if (intlength != 1) {
          if (intlength == 4) {
            ffswap4((int *)tiledata,tilelen);
            iVar2 = outfptr->Fptr->compress_type;
          }
          else if (intlength == 2) {
            ffswap2((short *)tiledata,tilelen);
            if (outfptr->Fptr->compress_type == 0x16) {
              fits_shuffle_2bytes((char *)tiledata,tilelen,status);
            }
            tilelen = tilelen * 2;
            goto LAB_001bd1af;
          }
joined_r0x001bd5a2:
          if (iVar2 == 0x16) {
            fits_shuffle_4bytes((char *)tiledata,tilelen,status);
          }
          tilelen = tilelen << 2;
        }
      }
      else {
        ffswap8((double *)tiledata,tilelen);
        if (outfptr->Fptr->compress_type == 0x16) {
          fits_shuffle_8bytes((char *)tiledata,tilelen,status);
        }
        tilelen = tilelen << 3;
      }
LAB_001bd1af:
      compress2mem_from_mem
                ((char *)tiledata,tilelen,(char **)&cbuf,&clen,realloc,&gzip_nelem,status);
      iVar8 = outfptr->Fptr->cn_compressed;
      sVar6 = gzip_nelem;
LAB_001bd614:
      ffpclb(outfptr,iVar8,row,1,sVar6,(uchar *)cbuf,status);
    }
    else {
      nx = (int)tilelen;
      if (iVar2 == 0xb) {
        iVar8 = pFVar10->rice_blocksize;
        iVar5 = (int)local_78;
        if (intlength == 1) {
          uVar3 = fits_rcomp_byte((char *)tiledata,nx,(uchar *)cbuf,iVar5,iVar8);
        }
        else if (intlength == 2) {
          uVar3 = fits_rcomp_short((short *)tiledata,nx,(uchar *)cbuf,iVar5,iVar8);
        }
        else {
          uVar3 = fits_rcomp((int *)tiledata,nx,(uchar *)cbuf,iVar5,iVar8);
        }
        if ((int)uVar3 < 0) {
          free(cbuf);
          pcVar11 = "error Rice compressing image tile (imcomp_compress_tile)";
LAB_001bcc1b:
          ffpmsg(pcVar11);
          *status = 0x19d;
          return 0x19d;
        }
        iVar8 = outfptr->Fptr->cn_compressed;
        sVar6 = (size_t)uVar3;
        goto LAB_001bd614;
      }
      if (iVar2 == 0x33) {
        if (intlength == 4) {
          ffswap4((int *)tiledata,tilelen);
        }
        else if (intlength == 2) {
          ffswap2((short *)tiledata,tilelen);
        }
        ffpmsg("bzip2 compression error");
        *status = 0x19d;
        return 0x19d;
      }
      if (iVar2 == 0x29) {
        fVar15 = pFVar10->hcomp_scale;
        if (fVar15 <= 0.0) {
          if (fVar15 < 0.0) {
            fVar15 = -fVar15;
          }
          iVar8 = (int)local_88;
          hcomp_len = local_78;
        }
        else {
          local_98 = ZEXT416((uint)fVar15);
          fits_img_stats_int((int *)tiledata,tilenx,tileny,iVar8,iVar5,(long *)0x0,(int *)0x0,
                             (int *)0x0,(double *)0x0,(double *)0x0,(double *)0x0,&noise2,&noise3,
                             &noise5,status);
          if (((noise2 != 0.0) || (NAN(noise2))) && (noise2 < noise3)) {
            noise3 = noise2;
          }
          iVar8 = (int)local_88;
          if (((noise5 != 0.0) || (NAN(noise5))) && (noise5 < noise3)) {
            noise3 = noise5;
          }
          fVar15 = (float)(noise3 * (double)(float)local_98._0_4_);
          hcomp_len = clen;
        }
        iVar5 = (int)(fVar15 + 0.5);
        if ((iVar8 == 0x10) || (iVar8 == 8)) {
          fits_hcompress((int *)tiledata,(int)tilenx,(int)tileny,iVar5,(char *)cbuf,&hcomp_len,
                         status);
        }
        else {
          if (*status < 1) {
            local_98._0_4_ = iVar5;
            sVar6 = 10000;
            if (tilelen < 10000) {
              sVar6 = tilelen;
            }
            __ptr = malloc(sVar6 * 8);
            if (__ptr == (void *)0x0) {
              ffpmsg("Out of memory. (fits_int_to_longlong_inplace)");
              *status = 0x71;
            }
            else {
              sVar7 = tilelen - sVar6;
              while (sVar9 = sVar7, 0 < (long)sVar6) {
                for (sVar7 = 0; sVar6 != sVar7; sVar7 = sVar7 + 1) {
                  *(long *)((long)__ptr + sVar7 * 8) =
                       (long)*(int *)((long)tiledata + sVar7 * 4 + sVar9 * 4);
                }
                memcpy((void *)(sVar9 * 8 + (long)tiledata),__ptr,sVar6 * 8);
                sVar7 = sVar9 - 10000;
                if ((long)sVar9 < 0x2711) {
                  sVar7 = 0;
                  sVar6 = sVar9;
                }
                if (sVar9 == 0) {
                  sVar6 = sVar9;
                }
              }
              free(__ptr);
            }
            iVar5 = local_98._0_4_;
          }
          fits_hcompress64((LONGLONG *)tiledata,(int)tilenx,(int)tileny,iVar5,(char *)cbuf,
                           &hcomp_len,status);
        }
        iVar8 = outfptr->Fptr->cn_compressed;
        sVar6 = hcomp_len;
        goto LAB_001bd614;
      }
      if (iVar2 == 0x1f) {
        sVar6 = 0;
        sVar7 = 0;
        if (0 < tilelen) {
          sVar7 = tilelen;
        }
        do {
          if (sVar7 == sVar6) {
            uVar3 = pl_p2li((int *)tiledata,1,cbuf,nx);
            if (-1 < (int)uVar3) {
              ffpcli(outfptr,outfptr->Fptr->cn_compressed,row,1,(ulong)uVar3,cbuf,status);
              goto LAB_001bd62c;
            }
            free(cbuf);
            pcVar11 = "error PLIO compressing image tile (imcomp_compress_tile)";
            goto LAB_001bcc1b;
          }
          lVar12 = sVar6 * 4;
          sVar6 = sVar6 + 1;
        } while (*(uint *)((long)tiledata + lVar12) < 0x1000000);
        pcVar11 = "data out of range for PLIO compression (0 - 2**24)";
        goto LAB_001bcc1b;
      }
    }
LAB_001bd62c:
    iVar8 = outfptr->Fptr->cn_zscale;
    if (0 < iVar8) {
      ffpcld(outfptr,iVar8,row,1,1,bscale,status);
      ffpcld(outfptr,outfptr->Fptr->cn_zzero,row,1,1,bzero,status);
    }
  }
  free(cbuf);
LAB_001bcc4e:
  return *status;
}

Assistant:

int imcomp_compress_tile (fitsfile *outfptr,
    long row,  /* tile number = row in the binary table that holds the compressed data */
    int datatype, 
    void *tiledata, 
    long tilelen,
    long tilenx,
    long tileny,
    int nullcheck,
    void *nullflagval,
    int *status)

/*
   This is the main compression routine.

   This routine does the following to the input tile of pixels:
        - if it is a float or double image, then it quantizes the pixels
        - compresses the integer pixel values
        - writes the compressed byte stream to the FITS file.

   If the tile cannot be quantized than the raw float or double values
   are losslessly compressed with gzip and then written to the output table.
   
   This input array may be modified by this routine.  If the array is of type TINT
   or TFLOAT, and the compression type is HCOMPRESS, then it must have been 
   allocated to be twice as large (8 bytes per pixel) to provide scratch space.

  Note that this routine does not fully support the implicit datatype conversion that
  is supported when writing to normal FITS images.  The datatype of the input array
  must have the same datatype (either signed or unsigned) as the output (compressed)
  FITS image in some cases.
*/
{
    int *idata;		/* quantized integer data */
    int cn_zblank, zbitpix, nullval;
    int flag = 1;  /* true by default; only = 0 if float data couldn't be quantized */
    int intlength;      /* size of integers to be compressed */
    double scale, zero, actual_bzero;
    long ii;
    size_t clen;		/* size of cbuf */
    short *cbuf;	/* compressed data */
    int  nelem = 0;		/* number of bytes */
    int tilecol;
    size_t gzip_nelem = 0;
    unsigned int bzlen;
    int ihcompscale;
    float hcompscale;
    double noise2, noise3, noise5;
    double bscale[1] = {1.}, bzero[1] = {0.};	/* scaling parameters */
    long  hcomp_len;
    LONGLONG *lldata;

    if (*status > 0)
        return(*status);

    /* check for special case of losslessly compressing floating point */
    /* images.  Only compression algorithm that supports this is GZIP */
    if ( (outfptr->Fptr)->quantize_level == NO_QUANTIZE) {
       if (((outfptr->Fptr)->compress_type != GZIP_1) &&
           ((outfptr->Fptr)->compress_type != GZIP_2)) {
           switch (datatype) {
            case TFLOAT:
            case TDOUBLE:
            case TCOMPLEX:
            case TDBLCOMPLEX:
              ffpmsg("Lossless compression of floating point images must use GZIP (imcomp_compress_tile)");
              return(*status = DATA_COMPRESSION_ERR);
            default:
              break;
          }
       }
    }

    /* free the previously saved tile if the input tile is for the same row */
    if ((outfptr->Fptr)->tilerow) {  /* has the tile cache been allocated? */

      /* calculate the column bin of the compressed tile */
      tilecol = (row - 1) % ((long)(((outfptr->Fptr)->znaxis[0] - 1) / ((outfptr->Fptr)->tilesize[0])) + 1);
      
      if ((outfptr->Fptr)->tilerow[tilecol] == row) {
        if (((outfptr->Fptr)->tiledata)[tilecol]) {
            free(((outfptr->Fptr)->tiledata)[tilecol]);
        }
	  
        if (((outfptr->Fptr)->tilenullarray)[tilecol]) {
            free(((outfptr->Fptr)->tilenullarray)[tilecol]);
        }

        ((outfptr->Fptr)->tiledata)[tilecol] = 0;
        ((outfptr->Fptr)->tilenullarray)[tilecol] = 0;
        (outfptr->Fptr)->tilerow[tilecol] = 0;
        (outfptr->Fptr)->tiledatasize[tilecol] = 0;
        (outfptr->Fptr)->tiletype[tilecol] = 0;
        (outfptr->Fptr)->tileanynull[tilecol] = 0;
      }
    }

    if ( (outfptr->Fptr)->compress_type == NOCOMPRESS) {
         /* Special case when using NOCOMPRESS for diagnostic purposes in fpack */
         if (imcomp_write_nocompress_tile(outfptr, row, datatype, tiledata, tilelen, 
	     nullcheck, nullflagval, status) > 0) {
             return(*status);
         }
         return(*status);
    }

    /* =========================================================================== */
    /* initialize various parameters */
    idata = (int *) tiledata;   /* may overwrite the input tiledata in place */

    /* zbitpix is the BITPIX keyword value in the uncompressed FITS image */
    zbitpix = (outfptr->Fptr)->zbitpix;

    /* if the tile/image has an integer datatype, see if a null value has */
    /* been defined (with the BLANK keyword in a normal FITS image).  */
    /* If so, and if the input tile array also contains null pixels, */
    /* (represented by pixels that have a value = nullflagval) then  */
    /* any pixels whose value = nullflagval, must be set to the value = nullval */
    /* before the pixel array is compressed.  These null pixel values must */
    /* not be inverse scaled by the BSCALE/BZERO values, if present. */

    cn_zblank = (outfptr->Fptr)->cn_zblank;
    nullval = (outfptr->Fptr)->zblank;

    if (zbitpix > 0 && cn_zblank != -1)  /* If the integer image has no defined null */
        nullcheck = 0;    /* value, then don't bother checking input array for nulls. */

    /* if the BSCALE and BZERO keywords exist, then the input values must */
    /* be inverse scaled by this factor, before the values are compressed. */
    /* (The program may have turned off scaling, which over rides the keywords) */
    
    scale = (outfptr->Fptr)->cn_bscale;
    zero  = (outfptr->Fptr)->cn_bzero;
    actual_bzero = (outfptr->Fptr)->cn_actual_bzero;

    /* =========================================================================== */
    /* prepare the tile of pixel values for compression */
    if (datatype == TSHORT) {
       imcomp_convert_tile_tshort(outfptr, tiledata, tilelen, nullcheck, nullflagval,
           nullval, zbitpix, scale, zero, actual_bzero, &intlength, status);
    } else if (datatype == TUSHORT) {
       imcomp_convert_tile_tushort(outfptr, tiledata, tilelen, nullcheck, nullflagval,
           nullval, zbitpix, scale, zero, &intlength, status);
    } else if (datatype == TBYTE) {
       imcomp_convert_tile_tbyte(outfptr, tiledata, tilelen, nullcheck, nullflagval,
           nullval, zbitpix, scale, zero,  &intlength, status);
    } else if (datatype == TSBYTE) {
       imcomp_convert_tile_tsbyte(outfptr, tiledata, tilelen, nullcheck, nullflagval,
           nullval, zbitpix, scale, zero,  &intlength, status);
    } else if (datatype == TINT) {
       imcomp_convert_tile_tint(outfptr, tiledata, tilelen, nullcheck, nullflagval,
           nullval, zbitpix, scale, zero, &intlength, status);
    } else if (datatype == TUINT) {
       imcomp_convert_tile_tuint(outfptr, tiledata, tilelen, nullcheck, nullflagval,
           nullval, zbitpix, scale, zero, &intlength, status);
    } else if (datatype == TLONG && sizeof(long) == 8) {
           ffpmsg("Integer*8 Long datatype is not supported when writing to compressed images");
           return(*status = BAD_DATATYPE);
    } else if (datatype == TULONG && sizeof(long) == 8) {
           ffpmsg("Unsigned integer*8 datatype is not supported when writing to compressed images");
           return(*status = BAD_DATATYPE);
    } else if (datatype == TFLOAT) {
        imcomp_convert_tile_tfloat(outfptr, row, tiledata, tilelen, tilenx, tileny, nullcheck,
        nullflagval, nullval, zbitpix, scale, zero, &intlength, &flag, bscale, bzero, status);
    } else if (datatype == TDOUBLE) {
       imcomp_convert_tile_tdouble(outfptr, row, tiledata, tilelen, tilenx, tileny, nullcheck,
       nullflagval, nullval, zbitpix, scale, zero, &intlength, &flag, bscale, bzero, status);
    } else {
          ffpmsg("unsupported image datatype (imcomp_compress_tile)");
          return(*status = BAD_DATATYPE);
    }

    if (*status > 0)
      return(*status);      /* return if error occurs */

    /* =========================================================================== */
    if (flag)   /* now compress the integer data array */
    {
        /* allocate buffer for the compressed tile bytes */
        clen = (outfptr->Fptr)->maxelem;
        cbuf = (short *) calloc (clen, sizeof (unsigned char));

        if (cbuf == NULL) {
            ffpmsg("Memory allocation failure. (imcomp_compress_tile)");
	    return (*status = MEMORY_ALLOCATION);
        }

        /* =========================================================================== */
        if ( (outfptr->Fptr)->compress_type == RICE_1)
        {
            if (intlength == 2) {
  	        nelem = fits_rcomp_short ((short *)idata, tilelen, (unsigned char *) cbuf,
                       clen, (outfptr->Fptr)->rice_blocksize);
            } else if (intlength == 1) {
  	        nelem = fits_rcomp_byte ((signed char *)idata, tilelen, (unsigned char *) cbuf,
                       clen, (outfptr->Fptr)->rice_blocksize);
            } else {
  	        nelem = fits_rcomp (idata, tilelen, (unsigned char *) cbuf,
                       clen, (outfptr->Fptr)->rice_blocksize);
            }

	    if (nelem < 0)  /* data compression error condition */
            {
	        free (cbuf);
                ffpmsg("error Rice compressing image tile (imcomp_compress_tile)");
                return (*status = DATA_COMPRESSION_ERR);
            }

	    /* Write the compressed byte stream. */
            ffpclb(outfptr, (outfptr->Fptr)->cn_compressed, row, 1,
                     nelem, (unsigned char *) cbuf, status);
        }

        /* =========================================================================== */
        else if ( (outfptr->Fptr)->compress_type == PLIO_1)
        {
              for (ii = 0; ii < tilelen; ii++)  {
                if (idata[ii] < 0 || idata[ii] > 16777215)
                {
                   /* plio algorithn only supports positive 24 bit ints */
                   ffpmsg("data out of range for PLIO compression (0 - 2**24)");
                   return(*status = DATA_COMPRESSION_ERR);
                }
              }

  	      nelem = pl_p2li (idata, 1, cbuf, tilelen);

	      if (nelem < 0)  /* data compression error condition */
              {
	        free (cbuf);
                ffpmsg("error PLIO compressing image tile (imcomp_compress_tile)");
                return (*status = DATA_COMPRESSION_ERR);
              }

	      /* Write the compressed byte stream. */
              ffpcli(outfptr, (outfptr->Fptr)->cn_compressed, row, 1,
                     nelem, cbuf, status);
        }

        /* =========================================================================== */
        else if ( ((outfptr->Fptr)->compress_type == GZIP_1) ||
                  ((outfptr->Fptr)->compress_type == GZIP_2) )   {

	    if ((outfptr->Fptr)->quantize_level == NO_QUANTIZE && datatype == TFLOAT) {
	      /* Special case of losslessly compressing floating point pixels with GZIP */
	      /* In this case we compress the input tile array directly */

#if BYTESWAPPED
               ffswap4((int*) tiledata, tilelen); 
#endif
               if ( (outfptr->Fptr)->compress_type == GZIP_2 )
		    fits_shuffle_4bytes((char *) tiledata, tilelen, status);

                compress2mem_from_mem((char *) tiledata, tilelen * sizeof(float),
                    (char **) &cbuf,  &clen, realloc, &gzip_nelem, status);

	    } else if ((outfptr->Fptr)->quantize_level == NO_QUANTIZE && datatype == TDOUBLE) {
	      /* Special case of losslessly compressing double pixels with GZIP */
	      /* In this case we compress the input tile array directly */

#if BYTESWAPPED
               ffswap8((double *) tiledata, tilelen); 
#endif
               if ( (outfptr->Fptr)->compress_type == GZIP_2 )
		    fits_shuffle_8bytes((char *) tiledata, tilelen, status);

                compress2mem_from_mem((char *) tiledata, tilelen * sizeof(double),
                    (char **) &cbuf,  &clen, realloc, &gzip_nelem, status);

	    } else {

	        /* compress the integer idata array */

#if BYTESWAPPED
	       if (intlength == 2)
                 ffswap2((short *) idata, tilelen); 
	       else if (intlength == 4)
                 ffswap4(idata, tilelen); 
#endif

               if (intlength == 2) {

                  if ( (outfptr->Fptr)->compress_type == GZIP_2 )
		    fits_shuffle_2bytes((char *) tiledata, tilelen, status);

                  compress2mem_from_mem((char *) idata, tilelen * sizeof(short),
                   (char **) &cbuf,  &clen, realloc, &gzip_nelem, status);

               } else if (intlength == 1) {

                  compress2mem_from_mem((char *) idata, tilelen * sizeof(unsigned char),
                   (char **) &cbuf,  &clen, realloc, &gzip_nelem, status);

               } else {

                  if ( (outfptr->Fptr)->compress_type == GZIP_2 )
		    fits_shuffle_4bytes((char *) tiledata, tilelen, status);

                  compress2mem_from_mem((char *) idata, tilelen * sizeof(int),
                   (char **) &cbuf,  &clen, realloc, &gzip_nelem, status);
               }
            }

	    /* Write the compressed byte stream. */
            ffpclb(outfptr, (outfptr->Fptr)->cn_compressed, row, 1,
                     gzip_nelem, (unsigned char *) cbuf, status);

        /* =========================================================================== */
        } else if ( (outfptr->Fptr)->compress_type == BZIP2_1) {

#if BYTESWAPPED
	   if (intlength == 2)
               ffswap2((short *) idata, tilelen); 
	   else if (intlength == 4)
               ffswap4(idata, tilelen); 
#endif

           bzlen = (unsigned int) clen;
	   
           /* call bzip2 with blocksize = 900K, verbosity = 0, and default workfactor */

/*  bzip2 is not supported in the public release.  This is only for test purposes.
           if (BZ2_bzBuffToBuffCompress( (char *) cbuf, &bzlen,
	         (char *) idata, (unsigned int) (tilelen * intlength), 9, 0, 0) ) 
*/
	   {
                   ffpmsg("bzip2 compression error");
                   return(*status = DATA_COMPRESSION_ERR);
           }

	    /* Write the compressed byte stream. */
            ffpclb(outfptr, (outfptr->Fptr)->cn_compressed, row, 1,
                     bzlen, (unsigned char *) cbuf, status);

        /* =========================================================================== */
        }  else if ( (outfptr->Fptr)->compress_type == HCOMPRESS_1)     {
	    /*
	      if hcompscale is positive, then we have to multiply
	      the value by the RMS background noise to get the 
	      absolute scale value.  If negative, then it gives the
	      absolute scale value directly.
	    */
            hcompscale = (outfptr->Fptr)->hcomp_scale;

	    if (hcompscale > 0.) {
	       fits_img_stats_int(idata, tilenx, tileny, nullcheck,
	                nullval, 0,0,0,0,0,0,&noise2,&noise3,&noise5,status);

		/* use the minimum of the 3 noise estimates */
		if (noise2 != 0. && noise2 < noise3) noise3 = noise2;
		if (noise5 != 0. && noise5 < noise3) noise3 = noise5;
		
		hcompscale = (float) (hcompscale * noise3);

	    } else if (hcompscale < 0.) {

		hcompscale = hcompscale * -1.0F;
	    }

	    ihcompscale = (int) (hcompscale + 0.5);

            hcomp_len = clen;  /* allocated size of the buffer */
	    
            if (zbitpix == BYTE_IMG || zbitpix == SHORT_IMG) {
                fits_hcompress(idata, tilenx, tileny, 
		  ihcompscale, (char *) cbuf, &hcomp_len, status);

            } else {
                 /* have to convert idata to an I*8 array, in place */
                 /* idata must have been allocated large enough to do this */

                fits_int_to_longlong_inplace(idata, tilelen, status);
                lldata = (LONGLONG *) idata;		

                fits_hcompress64(lldata, tilenx, tileny, 
		  ihcompscale, (char *) cbuf, &hcomp_len, status);
            }

	    /* Write the compressed byte stream. */
            ffpclb(outfptr, (outfptr->Fptr)->cn_compressed, row, 1,
                     hcomp_len, (unsigned char *) cbuf, status);
        }

        /* =========================================================================== */
        if ((outfptr->Fptr)->cn_zscale > 0)
        {
              /* write the linear scaling parameters for this tile */
	      ffpcld (outfptr, (outfptr->Fptr)->cn_zscale, row, 1, 1,
                      bscale, status);
	      ffpcld (outfptr, (outfptr->Fptr)->cn_zzero,  row, 1, 1,
                      bzero,  status);
        }

        free(cbuf);  /* finished with this buffer */

    /* =========================================================================== */
    } else {    /* if flag == 0., floating point data couldn't be quantized */

	 /* losslessly compress the data with gzip. */

         /* if gzip2 compressed data column doesn't exist, create it */
         if ((outfptr->Fptr)->cn_gzip_data < 1) {
              if ( (outfptr->Fptr)->request_huge_hdu != 0) {
                 fits_insert_col(outfptr, 999, "GZIP_COMPRESSED_DATA", "1QB", status);
              } else {
                 fits_insert_col(outfptr, 999, "GZIP_COMPRESSED_DATA", "1PB", status);
              }

                 if (*status <= 0)  /* save the number of this column */
                       ffgcno(outfptr, CASEINSEN, "GZIP_COMPRESSED_DATA",
                                &(outfptr->Fptr)->cn_gzip_data, status);
         }

         if (datatype == TFLOAT)  {
               /* allocate buffer for the compressed tile bytes */
	       /* make it 10% larger than the original uncompressed data */
               clen = (size_t) (tilelen * sizeof(float) * 1.1);
               cbuf = (short *) calloc (clen, sizeof (unsigned char));

               if (cbuf == NULL)
               {
                   ffpmsg("Memory allocation error. (imcomp_compress_tile)");
	           return (*status = MEMORY_ALLOCATION);
               }

	       /* convert null values to NaNs in place, if necessary */
	       if (nullcheck == 1) {
	           imcomp_float2nan((float *) tiledata, tilelen, (int *) tiledata,
	               *(float *) (nullflagval), status);
	       }

#if BYTESWAPPED
               ffswap4((int*) tiledata, tilelen); 
#endif
               compress2mem_from_mem((char *) tiledata, tilelen * sizeof(float),
                    (char **) &cbuf,  &clen, realloc, &gzip_nelem, status);

         } else {  /* datatype == TDOUBLE */

               /* allocate buffer for the compressed tile bytes */
	       /* make it 10% larger than the original uncompressed data */
               clen = (size_t) (tilelen * sizeof(double) * 1.1);
               cbuf = (short *) calloc (clen, sizeof (unsigned char));

               if (cbuf == NULL)
               {
                   ffpmsg("Memory allocation error. (imcomp_compress_tile)");
	           return (*status = MEMORY_ALLOCATION);
               }

	       /* convert null values to NaNs in place, if necessary */
	       if (nullcheck == 1) {
	           imcomp_double2nan((double *) tiledata, tilelen, (LONGLONG *) tiledata,
	               *(double *) (nullflagval), status);
	       }

#if BYTESWAPPED
               ffswap8((double*) tiledata, tilelen); 
#endif
               compress2mem_from_mem((char *) tiledata, tilelen * sizeof(double),
                    (char **) &cbuf,  &clen, realloc, &gzip_nelem, status);
        }

	/* Write the compressed byte stream. */
        ffpclb(outfptr, (outfptr->Fptr)->cn_gzip_data, row, 1,
             gzip_nelem, (unsigned char *) cbuf, status);

        free(cbuf);  /* finished with this buffer */
    }

    return(*status);
}